

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ym2612_Emu.cpp
# Opt level: O2

int __thiscall Ym2612_Impl::SLOT_SET(Ym2612_Impl *this,int Adr,int data)

{
  slot_t *psVar1;
  int iVar2;
  ulong uVar3;
  uint *puVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  
  if ((Adr & 3U) == 3) {
    return 1;
  }
  uVar8 = (Adr & 0xf0U) - 0x30 >> 4;
  iVar2 = 0;
  if (6 < uVar8) {
    return iVar2;
  }
  uVar7 = ((Adr << 0x17) >> 0x1f & 3U) + (Adr & 3U);
  uVar5 = (uint)Adr >> 2 & 3;
  switch(uVar8) {
  case 0:
    iVar6 = 1;
    if ((data & 0xfU) != 0) {
      iVar6 = (data & 0xfU) * 2;
    }
    (this->YM2612).CHANNEL[uVar7].SLOT[uVar5].MUL = iVar6;
    (this->YM2612).CHANNEL[uVar7].SLOT[uVar5].DT =
         (int *)((this->g).DT_TAB[0] + (ulong)(data & 0x70) * 2);
    (this->YM2612).CHANNEL[uVar7].SLOT[0].Finc = -1;
    return iVar2;
  case 1:
    (this->YM2612).CHANNEL[uVar7].SLOT[uVar5].TL = data & 0x7fU;
    (this->YM2612).CHANNEL[uVar7].SLOT[uVar5].TLL = (data & 0x7fU) << 5;
    return iVar2;
  case 2:
    (this->YM2612).CHANNEL[uVar7].SLOT[uVar5].KSR_S = 3 - (data >> 6);
    (this->YM2612).CHANNEL[uVar7].SLOT[0].Finc = -1;
    puVar4 = (this->g).AR_TAB + (ulong)(data & 0x1fU) * 2;
    if ((data & 0x1fU) == 0) {
      puVar4 = (this->g).NULL_RATE;
    }
    (this->YM2612).CHANNEL[uVar7].SLOT[uVar5].AR = (int *)puVar4;
    uVar8 = puVar4[(this->YM2612).CHANNEL[uVar7].SLOT[uVar5].KSR];
    (this->YM2612).CHANNEL[uVar7].SLOT[uVar5].EincA = uVar8;
    if ((this->YM2612).CHANNEL[uVar7].SLOT[uVar5].Ecurp != 0) {
      return iVar2;
    }
    goto LAB_00621aba;
  case 3:
    (this->YM2612).CHANNEL[uVar7].SLOT[uVar5].AMSon = data & 0x80U;
    if ((data & 0x80U) == 0) {
      iVar6 = 0x1f;
    }
    else {
      iVar6 = (this->YM2612).CHANNEL[uVar7].AMS;
    }
    (this->YM2612).CHANNEL[uVar7].SLOT[uVar5].AMS = iVar6;
    puVar4 = (this->g).DR_TAB + (ulong)(data & 0x1fU) * 2;
    if ((data & 0x1fU) == 0) {
      puVar4 = (this->g).NULL_RATE;
    }
    (this->YM2612).CHANNEL[uVar7].SLOT[uVar5].DR = (int *)puVar4;
    uVar8 = puVar4[(this->YM2612).CHANNEL[uVar7].SLOT[uVar5].KSR];
    (this->YM2612).CHANNEL[uVar7].SLOT[uVar5].EincD = uVar8;
    if ((this->YM2612).CHANNEL[uVar7].SLOT[uVar5].Ecurp != 1) {
      return iVar2;
    }
    goto LAB_00621aba;
  case 4:
    puVar4 = (this->g).DR_TAB + (ulong)(data & 0x1fU) * 2;
    if ((data & 0x1fU) == 0) {
      puVar4 = (this->g).NULL_RATE;
    }
    (this->YM2612).CHANNEL[uVar7].SLOT[uVar5].SR = (int *)puVar4;
    uVar8 = puVar4[(this->YM2612).CHANNEL[uVar7].SLOT[uVar5].KSR];
    (this->YM2612).CHANNEL[uVar7].SLOT[uVar5].EincS = uVar8;
    if ((this->YM2612).CHANNEL[uVar7].SLOT[uVar5].Ecurp != 2) {
      return iVar2;
    }
    break;
  case 5:
    (this->YM2612).CHANNEL[uVar7].SLOT[uVar5].SLL = (this->g).SL_TAB[data >> 4];
    uVar3 = (ulong)((data & 0xfU) << 4 | 8);
    (this->YM2612).CHANNEL[uVar7].SLOT[uVar5].RR = (int *)((long)(this->g).DR_TAB + uVar3);
    uVar8 = *(uint *)((long)(this->g).DR_TAB +
                     (long)(this->YM2612).CHANNEL[uVar7].SLOT[uVar5].KSR * 4 + uVar3);
    (this->YM2612).CHANNEL[uVar7].SLOT[uVar5].EincR = uVar8;
    if ((this->YM2612).CHANNEL[uVar7].SLOT[uVar5].Ecurp != 3) {
      return iVar2;
    }
    break;
  case 6:
    uVar8 = (data << 0x1c) >> 0x1f & data;
    psVar1 = (this->YM2612).CHANNEL[uVar7].SLOT + uVar5;
    psVar1->env_xor = 0;
    psVar1->env_max = 0x7fffffff;
    (this->YM2612).CHANNEL[uVar7].SLOT[uVar5].SEG = uVar8 & 0xf;
    if ((uVar8 & 4) == 0) {
      return iVar2;
    }
    psVar1 = (this->YM2612).CHANNEL[uVar7].SLOT + uVar5;
    psVar1->env_xor = 0xfff;
    psVar1->env_max = 0xfff;
    return iVar2;
  }
  if (0x1fffffff < (this->YM2612).CHANNEL[uVar7].SLOT[uVar5].Ecnt) {
    return iVar2;
  }
LAB_00621aba:
  (this->YM2612).CHANNEL[uVar7].SLOT[uVar5].Einc = uVar8;
  return iVar2;
}

Assistant:

int Ym2612_Impl::SLOT_SET( int Adr, int data )
{
	int nch = Adr & 3;
	if ( nch == 3 )
		return 1;
	
	channel_t& ch = YM2612.CHANNEL [nch + (Adr & 0x100 ? 3 : 0)];
	slot_t& sl = ch.SLOT [(Adr >> 2) & 3];

	switch ( Adr & 0xF0 )
	{
		case 0x30:
			if ( (sl.MUL = (data & 0x0F)) != 0 ) sl.MUL <<= 1;
			else sl.MUL = 1;

			sl.DT = (int*) g.DT_TAB [(data >> 4) & 7];

			ch.SLOT [0].Finc = -1;

			break;

		case 0x40:
			sl.TL = data & 0x7F;

			// SOR2 do a lot of TL adjustement and this fix R.Shinobi jump sound...
			YM2612_Special_Update();

#if ((ENV_HBITS - 7) < 0)
			sl.TLL = sl.TL >> (7 - ENV_HBITS);
#else
			sl.TLL = sl.TL << (ENV_HBITS - 7);
#endif

			break;

		case 0x50:
			sl.KSR_S = 3 - (data >> 6);

			ch.SLOT [0].Finc = -1;

			if (data &= 0x1F) sl.AR = (int*) &g.AR_TAB [data << 1];
			else sl.AR = (int*) &g.NULL_RATE [0];

			sl.EincA = sl.AR [sl.KSR];
			if (sl.Ecurp == ATTACK) sl.Einc = sl.EincA;
			break;

		case 0x60:
			if ( (sl.AMSon = (data & 0x80)) != 0 ) sl.AMS = ch.AMS;
			else sl.AMS = 31;

			if (data &= 0x1F) sl.DR = (int*) &g.DR_TAB [data << 1];
			else sl.DR = (int*) &g.NULL_RATE [0];

			sl.EincD = sl.DR [sl.KSR];
			if (sl.Ecurp == DECAY) sl.Einc = sl.EincD;
			break;

		case 0x70:
			if (data &= 0x1F) sl.SR = (int*) &g.DR_TAB [data << 1];
			else sl.SR = (int*) &g.NULL_RATE [0];

			sl.EincS = sl.SR [sl.KSR];
			if ((sl.Ecurp == SUBSTAIN) && (sl.Ecnt < ENV_END)) sl.Einc = sl.EincS;
			break;

		case 0x80:
			sl.SLL = g.SL_TAB [data >> 4];

			sl.RR = (int*) &g.DR_TAB [((data & 0xF) << 2) + 2];

			sl.EincR = sl.RR [sl.KSR];
			if ((sl.Ecurp == RELEASE) && (sl.Ecnt < ENV_END)) sl.Einc = sl.EincR;
			break;

		case 0x90:
			// SSG-EG envelope shapes :
			/*
			   E  At Al H
			  
			   1  0  0  0  \\\\
			   1  0  0  1  \___
			   1  0  1  0  \/\/
			   1  0  1  1  \
			   1  1  0  0  ////
			   1  1  0  1  /
			   1  1  1  0  /\/\
			   1  1  1  1  /___
			  
			   E  = SSG-EG enable
			   At = Start negate
			   Al = Altern
			   H  = Hold */

			set_seg( sl, (data & 8) ? (data & 0x0F) : 0 );
			break;
	}

	return 0;
}